

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_max_gap(REF_GRID ref_grid,REF_DBL *max_gap)

{
  REF_NODE pRVar1;
  REF_GEOM ref_geom;
  REF_DBL *pRVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  long lVar6;
  REF_MPI ref_mpi;
  char *pcVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  REF_DBL global_max;
  REF_DBL xyz [3];
  double local_78;
  double local_70;
  double local_68;
  double dStack_60;
  double local_58;
  double *local_48;
  REF_MPI local_40;
  double local_38;
  
  ref_mpi = ref_grid->mpi;
  pRVar1 = ref_grid->node;
  ref_geom = ref_grid->geom;
  *max_gap = 0.0;
  uVar4 = 0;
  if (ref_geom->model != (void *)0x0) {
    local_78 = 0.0;
    iVar3 = ref_geom->max;
    local_48 = max_gap;
    local_40 = ref_mpi;
    if (0 < iVar3) {
      dVar10 = 0.0;
      lVar8 = 0;
      lVar6 = 0;
      do {
        if ((*(int *)((long)ref_geom->descr + lVar8) == 0) &&
           (lVar9 = (long)*(int *)((long)ref_geom->descr + lVar8 + 0x14),
           ref_mpi->id == pRVar1->part[lVar9])) {
          local_38 = dVar10;
          uVar4 = ref_egads_eval(ref_geom,(REF_INT)lVar6,&local_68,(REF_DBL *)0x0);
          if (uVar4 != 0) {
            pcVar7 = "eval xyz";
            uVar5 = 0x727;
            goto LAB_00159033;
          }
          pRVar2 = pRVar1->real;
          dVar11 = SQRT((local_58 - pRVar2[lVar9 * 0xf + 2]) * (local_58 - pRVar2[lVar9 * 0xf + 2])
                        + (dStack_60 - pRVar2[lVar9 * 0xf + 1]) *
                          (dStack_60 - pRVar2[lVar9 * 0xf + 1]) +
                          (local_68 - pRVar2[lVar9 * 0xf]) * (local_68 - pRVar2[lVar9 * 0xf]));
          dVar10 = local_38;
          if (local_38 <= dVar11) {
            dVar10 = dVar11;
          }
          iVar3 = ref_geom->max;
          ref_mpi = local_40;
          local_78 = dVar10;
        }
        lVar6 = lVar6 + 1;
        lVar8 = lVar8 + 0x18;
      } while (lVar6 < iVar3);
    }
    uVar4 = ref_mpi_max(ref_mpi,&local_78,&local_70,3);
    if (uVar4 == 0) {
      dVar10 = *local_48;
      if (*local_48 <= local_70) {
        dVar10 = local_70;
      }
      *local_48 = dVar10;
      local_78 = 0.0;
      iVar3 = ref_geom->max;
      if (0 < iVar3) {
        lVar8 = 0;
        lVar6 = 0;
        do {
          if ((*(int *)((long)ref_geom->descr + lVar8) == 1) &&
             (lVar9 = (long)*(int *)((long)ref_geom->descr + lVar8 + 0x14),
             ref_mpi->id == pRVar1->part[lVar9])) {
            uVar4 = ref_egads_eval(ref_geom,(REF_INT)lVar6,&local_68,(REF_DBL *)0x0);
            if (uVar4 != 0) {
              pcVar7 = "eval xyz";
              uVar5 = 0x735;
              goto LAB_00159033;
            }
            pRVar2 = pRVar1->real;
            dVar10 = SQRT((local_58 - pRVar2[lVar9 * 0xf + 2]) *
                          (local_58 - pRVar2[lVar9 * 0xf + 2]) +
                          (dStack_60 - pRVar2[lVar9 * 0xf + 1]) *
                          (dStack_60 - pRVar2[lVar9 * 0xf + 1]) +
                          (local_68 - pRVar2[lVar9 * 0xf]) * (local_68 - pRVar2[lVar9 * 0xf]));
            if (local_78 <= dVar10) {
              local_78 = dVar10;
            }
            iVar3 = ref_geom->max;
            ref_mpi = local_40;
          }
          lVar6 = lVar6 + 1;
          lVar8 = lVar8 + 0x18;
        } while (lVar6 < iVar3);
      }
      uVar4 = ref_mpi_max(ref_mpi,&local_78,&local_70,3);
      if (uVar4 == 0) {
        dVar10 = *local_48;
        if (*local_48 <= local_70) {
          dVar10 = local_70;
        }
        *local_48 = dVar10;
        local_78 = 0.0;
        iVar3 = ref_geom->max;
        if (0 < iVar3) {
          lVar8 = 0;
          lVar6 = 0;
          do {
            if ((*(int *)((long)ref_geom->descr + lVar8) == 2) &&
               (lVar9 = (long)*(int *)((long)ref_geom->descr + lVar8 + 0x14),
               ref_mpi->id == pRVar1->part[lVar9])) {
              uVar4 = ref_egads_eval(ref_geom,(REF_INT)lVar6,&local_68,(REF_DBL *)0x0);
              if (uVar4 != 0) {
                pcVar7 = "eval xyz";
                uVar5 = 0x743;
                goto LAB_00159033;
              }
              pRVar2 = pRVar1->real;
              dVar10 = SQRT((local_58 - pRVar2[lVar9 * 0xf + 2]) *
                            (local_58 - pRVar2[lVar9 * 0xf + 2]) +
                            (dStack_60 - pRVar2[lVar9 * 0xf + 1]) *
                            (dStack_60 - pRVar2[lVar9 * 0xf + 1]) +
                            (local_68 - pRVar2[lVar9 * 0xf]) * (local_68 - pRVar2[lVar9 * 0xf]));
              if (local_78 <= dVar10) {
                local_78 = dVar10;
              }
              iVar3 = ref_geom->max;
              ref_mpi = local_40;
            }
            lVar6 = lVar6 + 1;
            lVar8 = lVar8 + 0x18;
          } while (lVar6 < iVar3);
        }
        uVar4 = ref_mpi_max(ref_mpi,&local_78,&local_70,3);
        if (uVar4 == 0) {
          local_78 = local_70;
          dVar10 = *local_48;
          if (*local_48 <= local_70) {
            dVar10 = local_70;
          }
          *local_48 = dVar10;
          uVar4 = ref_mpi_bcast(ref_mpi,local_48,1,3);
          if (uVar4 == 0) {
            return 0;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x74c,"ref_geom_max_gap",(ulong)uVar4,"mpi bcast gap");
          return uVar4;
        }
        pcVar7 = "mpi max face";
        uVar5 = 0x749;
      }
      else {
        pcVar7 = "mpi max edge";
        uVar5 = 0x73b;
      }
    }
    else {
      pcVar7 = "mpi max node";
      uVar5 = 0x72d;
    }
LAB_00159033:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar5,
           "ref_geom_max_gap",(ulong)uVar4,pcVar7);
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_geom_max_gap(REF_GRID ref_grid, REF_DBL *max_gap) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT geom;
  REF_INT node;
  REF_DBL xyz[3];
  REF_DBL dist, max, global_max;

  *max_gap = 0.0;

  if (!ref_geom_model_loaded(ref_geom)) return REF_SUCCESS;

  max = 0.0;
  each_ref_geom_node(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    max = MAX(max, dist);
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max node");
  max = global_max;
  *max_gap = MAX(*max_gap, max);

  max = 0.0;
  each_ref_geom_edge(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    max = MAX(max, dist);
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max edge");
  max = global_max;
  *max_gap = MAX(*max_gap, max);

  max = 0.0;
  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    max = MAX(max, dist);
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max face");
  max = global_max;
  *max_gap = MAX(*max_gap, max);
  RSS(ref_mpi_bcast(ref_mpi, max_gap, 1, REF_DBL_TYPE), "mpi bcast gap");

  return REF_SUCCESS;
}